

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
ClearAllocators(HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_> *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_00;
  FreeObject *this_01;
  undefined8 *in_FS_OFFSET;
  
  HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>::
  ForEachAllocator<Memory::HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>::ClearAllocators()::_lambda(Memory::SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>*)_1_>
            ();
  this_01 = this->explicitFreeList;
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  do {
    if (this_01 == (FreeObject *)0x0) {
      this->explicitFreeList = (FreeObject *)0x0;
      return;
    }
    this_00 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
              Recycler::FindHeapBlock(((this->super_HeapBucket).heapInfo)->recycler,this_01);
    if (this_00 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x109,"(heapBlock != nullptr)","heapBlock != nullptr");
      if (!bVar3) goto LAB_0024609b;
      *puVar1 = 0;
    }
    if ((this_00->super_HeapBlock).heapBlockType == LargeBlockType) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x10a,"(!heapBlock->IsLargeHeapBlock())","!heapBlock->IsLargeHeapBlock()")
      ;
      if (!bVar3) {
LAB_0024609b:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    SmallHeapBlockT<MediumAllocationBlockAttributes>::ClearExplicitFreeBitForObject(this_00,this_01)
    ;
    this_01 = FreeObject::GetNext(this_01);
  } while( true );
}

Assistant:

void
HeapBucketT<TBlockType>::ClearAllocators()
{
    ForEachAllocator([](TBlockAllocatorType * allocator) { ClearAllocator(allocator); });

#ifdef RECYCLER_PAGE_HEAP

#endif

#ifdef RECYCLER_MEMORY_VERIFY
    FreeObject* freeObject = this->explicitFreeList;

    while (freeObject)
    {
        HeapBlock* heapBlock = this->GetRecycler()->FindHeapBlock((void*)freeObject);
        Assert(heapBlock != nullptr);
        Assert(!heapBlock->IsLargeHeapBlock());
        TBlockType* smallBlock = (TBlockType*)heapBlock;

        smallBlock->ClearExplicitFreeBitForObject((void*)freeObject);
        freeObject = freeObject->GetNext();
    }
#endif

    this->explicitFreeList = nullptr;
}